

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  _Bool _Var2;
  CURLcode CVar3;
  int query_00;
  curltime *when;
  curltime cVar4;
  
  if ((cf->field_0x24 & 1) == 0) {
    pCVar1 = (Curl_cfilter *)cf->ctx;
    if (query == 7) {
      if ((((pCVar1[1].next == (Curl_cfilter *)0x0) || (*(int *)&pCVar1[1].ctx != 0)) ||
          (_Var2 = Curl_conn_cf_needs_flush(pCVar1[1].next,data), !_Var2)) &&
         ((((Curl_cfilter *)pCVar1[2].ctx == (Curl_cfilter *)0x0 || (*(int *)&pCVar1[2].conn != 0))
          || (_Var2 = Curl_conn_cf_needs_flush((Curl_cfilter *)pCVar1[2].ctx,data), !_Var2))))
      goto LAB_00114ed5;
      *pres1 = 1;
    }
    else {
      if (query == 5) {
        query_00 = 5;
      }
      else {
        if (query != 4) goto LAB_00114ed5;
        query_00 = 4;
      }
      cVar4 = cf_get_max_baller_time(pCVar1,data,query_00);
      *(time_t *)pres2 = cVar4.tv_sec;
      *(int *)((long)pres2 + 8) = cVar4.tv_usec;
    }
    return CURLE_OK;
  }
LAB_00114ed5:
  pCVar1 = cf->next;
  if (pCVar1 == (Curl_cfilter *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar3 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
  return CVar3;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_NEED_FLUSH: {
      if(cf_hc_baller_needs_flush(&ctx->h3_baller, data)
         || cf_hc_baller_needs_flush(&ctx->h21_baller, data)) {
        *pres1 = TRUE;
        return CURLE_OK;
      }
      break;
    }
    default:
      break;
    }
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}